

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_regular_transfer(connectdata *conn,_Bool *dophase_done)

{
  SessionHandle *data_00;
  ftp_conn *ftpc;
  SessionHandle *data;
  _Bool connected;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  data._3_1_ = 0;
  data_00 = conn->data;
  (data_00->req).size = -1;
  p_Stack_20 = dophase_done;
  dophase_done_local = (_Bool *)conn;
  Curl_pgrsSetUploadCounter(data_00,0);
  Curl_pgrsSetDownloadCounter(data_00,0);
  Curl_pgrsSetUploadSize(data_00,-1);
  Curl_pgrsSetDownloadSize(data_00,-1);
  (conn->proto).ftpc.ctl_valid = true;
  data._4_4_ = ftp_perform((connectdata *)dophase_done_local,(_Bool *)((long)&data + 3),p_Stack_20);
  if (data._4_4_ == CURLE_OK) {
    if ((*p_Stack_20 & 1U) == 0) {
      return CURLE_OK;
    }
    data._4_4_ = ftp_dophase_done((connectdata *)dophase_done_local,(_Bool)(data._3_1_ & 1));
    if (data._4_4_ != CURLE_OK) {
      return data._4_4_;
    }
  }
  else {
    freedirs(&(conn->proto).ftpc);
  }
  return data._4_4_;
}

Assistant:

static
CURLcode ftp_regular_transfer(struct connectdata *conn,
                              bool *dophase_done)
{
  CURLcode result=CURLE_OK;
  bool connected=FALSE;
  struct SessionHandle *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  data->req.size = -1; /* make sure this is unknown at this point */

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);
  Curl_pgrsSetUploadSize(data, -1);
  Curl_pgrsSetDownloadSize(data, -1);

  ftpc->ctl_valid = TRUE; /* starts good */

  result = ftp_perform(conn,
                       &connected, /* have we connected after PASV/PORT */
                       dophase_done); /* all commands in the DO-phase done? */

  if(!result) {

    if(!*dophase_done)
      /* the DO phase has not completed yet */
      return CURLE_OK;

    result = ftp_dophase_done(conn, connected);

    if(result)
      return result;
  }
  else
    freedirs(ftpc);

  return result;
}